

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.h
# Opt level: O0

TestResult * __thiscall JsonTest::TestResult::operator<<(TestResult *this,ValueType *value)

{
  TestResult *pTVar1;
  int *in_RSI;
  TestResult *in_RDI;
  ostringstream oss;
  string *in_stack_fffffffffffffe38;
  string local_1b8 [48];
  long local_188 [47];
  int *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  std::ios_base::precision((ios_base *)((long)local_188 + *(long *)(local_188[0] + -0x18)),0x10);
  std::ios_base::setf((ios_base *)in_RDI,(fmtflags)((ulong)in_stack_fffffffffffffe38 >> 0x20));
  std::ostream::operator<<(local_188,*local_10);
  std::__cxx11::ostringstream::str();
  pTVar1 = addToLastFailure(in_RDI,in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  return pTVar1;
}

Assistant:

TestResult& operator<<(const T& value) {
    std::ostringstream oss;
    oss.precision(16);
    oss.setf(std::ios_base::floatfield);
    oss << value;
    return addToLastFailure(oss.str());
  }